

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O2

void __thiscall
Omega_h::Mesh::set_tag<long>(Mesh *this,Int ent_dim,string *name,Read<long> *array,bool internal)

{
  Alloc *pAVar1;
  LO b;
  int ncomps;
  size_t sVar2;
  Write<int> local_40;
  
  pAVar1 = (array->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  b = nents(this,ent_dim);
  ncomps = divide_no_remainder<int>((int)(sVar2 >> 3),b);
  Write<long>::Write(&local_40,(Write<int> *)array);
  add_tag<long>(this,ent_dim,name,ncomps,(Read<long> *)&local_40,internal);
  Write<long>::~Write((Write<long> *)&local_40);
  return;
}

Assistant:

void Mesh::set_tag(
    Int ent_dim, std::string const& name, Read<T> array, bool internal) {
  this->add_tag(ent_dim, name, divide_no_remainder(array.size(), nents(ent_dim)), array, internal);
}